

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_device_memory_device.cpp
# Opt level: O3

void renderFrameStandard(int *pixels,uint width,uint height,float time,ISPCCamera *camera)

{
  char cVar1;
  int iVar2;
  task *ptVar3;
  runtime_error *this;
  uint uVar4;
  int numTilesY;
  int numTilesX;
  task_group_context context;
  small_object_pool *local_110;
  uint local_104;
  uint local_100;
  float local_fc;
  uint local_f8;
  uint local_f4;
  int **local_f0;
  uint *local_e8;
  uint *local_e0;
  float *local_d8;
  ISPCCamera *local_d0;
  uint *local_c8;
  uint *local_c0;
  int *local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  wait_context local_a0;
  task_group_context local_90;
  
  local_f0 = &local_b8;
  local_e8 = &local_f4;
  local_e0 = &local_f8;
  local_d8 = &local_fc;
  local_100 = width + 7 >> 3;
  local_c8 = &local_100;
  local_104 = height + 7 >> 3;
  local_c0 = &local_104;
  uVar4 = local_104 * local_100;
  local_90.my_version = proxy_support;
  local_90.my_traits = (context_traits)0x4;
  local_90.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_90.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_90.my_name = CUSTOM_CTX;
  local_fc = time;
  local_f8 = height;
  local_f4 = width;
  local_d0 = camera;
  local_b8 = pixels;
  tbb::detail::r1::initialize(&local_90);
  if (uVar4 != 0) {
    local_110 = (small_object_pool *)0x0;
    ptVar3 = (task *)tbb::detail::r1::allocate(&local_110,0x80);
    ptVar3->m_reserved[3] = 0;
    ptVar3->m_reserved[4] = 0;
    ptVar3->m_reserved[1] = 0;
    ptVar3->m_reserved[2] = 0;
    (ptVar3->super_task_traits).m_version_and_traits = 0;
    ptVar3->m_reserved[0] = 0;
    ptVar3->m_reserved[5] = 0;
    ptVar3->_vptr_task = (_func_int **)&PTR__task_002c4da0;
    ptVar3[1]._vptr_task = (_func_int **)(ulong)uVar4;
    ptVar3[1].super_task_traits.m_version_and_traits = 0;
    ptVar3[1].m_reserved[0] = 1;
    ptVar3[1].m_reserved[1] = (uint64_t)&local_f0;
    iVar2 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)(ptVar3[1].m_reserved + 4) = 0;
    *(undefined1 *)((long)ptVar3[1].m_reserved + 0x24) = 5;
    ptVar3[1].m_reserved[3] = (long)iVar2 * 2 & 0x7ffffffffffffffe;
    ptVar3[1].m_reserved[5] = (uint64_t)local_110;
    local_b0 = 0;
    local_a8 = 1;
    local_a0.m_version_and_traits = 1;
    local_a0.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    ptVar3[1].m_reserved[2] = (uint64_t)&local_b0;
    tbb::detail::r1::execute_and_wait(ptVar3,&local_90,&local_a0,&local_90);
  }
  cVar1 = tbb::detail::r1::is_group_execution_cancelled(&local_90);
  if (cVar1 == '\0') {
    tbb::detail::r1::destroy(&local_90);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"task cancelled");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void renderFrameStandard (int* pixels,
                          const unsigned int width,
                          const unsigned int height,
                          const float time,
                          const ISPCCamera& camera)
{
#if defined(EMBREE_SYCL_TUTORIAL) && !defined(EMBREE_SYCL_RT_SIMULATION) && !defined(EMBREE_SYCL_RT_SIMULATION)
  TutorialData ldata = data;
  sycl::event event = global_gpu_queue->submit([=](sycl::handler& cgh){
    const sycl::nd_range<2> nd_range = make_nd_range(height,width);
    cgh.parallel_for(nd_range,[=](sycl::nd_item<2> item) {
      const unsigned int x = item.get_global_id(1); if (x >= width ) return;
      const unsigned int y = item.get_global_id(0); if (y >= height) return;
      RayStats stats;
      renderPixelStandard(ldata,x,y,pixels,width,height,time,camera,stats);
    });
  });
  global_gpu_queue->wait_and_throw();

  const auto t0 = event.template get_profiling_info<sycl::info::event_profiling::command_start>();
  const auto t1 = event.template get_profiling_info<sycl::info::event_profiling::command_end>();
  const double dt = (t1-t0)*1E-9;
  ((ISPCCamera*)&camera)->render_time = dt;
#else
  const int numTilesX = (width +TILE_SIZE_X-1)/TILE_SIZE_X;
  const int numTilesY = (height+TILE_SIZE_Y-1)/TILE_SIZE_Y;
  parallel_for(size_t(0),size_t(numTilesX*numTilesY),[&](const range<size_t>& range) {
    const int threadIndex = (int)TaskScheduler::threadIndex();
    for (size_t i=range.begin(); i<range.end(); i++)
      renderTileTask((int)i,threadIndex,pixels,width,height,time,camera,numTilesX,numTilesY);
  }); 
#endif
}